

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darMan.c
# Opt level: O0

void Dar_ManStop(Dar_Man_t *p)

{
  Dar_Man_t *p_local;
  
  if (p->pPars->fVerbose != 0) {
    Dar_ManPrintStats(p);
  }
  if (p->vCutNodes != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vCutNodes);
  }
  if (p->pMemCuts != (Aig_MmFixed_t *)0x0) {
    Aig_MmFixedStop(p->pMemCuts,0);
  }
  if (p->vLeavesBest != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vLeavesBest);
  }
  if (p != (Dar_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Dar_ManStop( Dar_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Dar_ManPrintStats( p );
    if ( p->vCutNodes )
        Vec_PtrFree( p->vCutNodes );
    if ( p->pMemCuts )
        Aig_MmFixedStop( p->pMemCuts, 0 );
    if ( p->vLeavesBest ) 
        Vec_PtrFree( p->vLeavesBest );
    ABC_FREE( p );
}